

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FICDATADecoder::decode(FICDATADecoder *this,uint8_t *data,size_t len)

{
  undefined8 uVar1;
  uint8_t *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_Assimp::FIValue> sVar2;
  undefined1 local_48 [24];
  string local_30;
  
  parseUTF8String_abi_cxx11_((string *)(local_48 + 0x18),(Assimp *)len,in_RCX,(size_t)in_RCX);
  FICDATAValue::create((string *)local_48);
  uVar1 = local_48._8_8_;
  local_48._8_8_ = 0;
  *this = (FICDATADecoder)local_48._0_8_;
  this[1] = (FICDATADecoder)uVar1;
  local_48._0_8_ = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__cxx11::string::~string((string *)(local_48 + 0x18));
  sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        return FICDATAValue::create(parseUTF8String(data, len));
    }